

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O0

optional<float> * __thiscall
tinyusdz::primvar::PrimVar::get_default_value<float>
          (optional<float> *__return_storage_ptr__,PrimVar *this)

{
  optional<float> local_20;
  PrimVar *local_18;
  PrimVar *this_local;
  
  local_18 = this;
  this_local = (PrimVar *)__return_storage_ptr__;
  get_value<float>(&local_20,this);
  nonstd::optional_lite::optional<float>::optional<float,_0>(__return_storage_ptr__,&local_20);
  nonstd::optional_lite::optional<float>::~optional(&local_20);
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_default_value() const {
    return get_value<T>();
  }